

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserver.cpp
# Opt level: O0

void server_pump_queue(void *server_void)

{
  long lVar1;
  size_t client_00;
  bool bVar2;
  PacketFamily family;
  PacketAction action_00;
  int iVar3;
  reference ppCVar4;
  size_type sVar5;
  mapped_type *this;
  reference pvVar6;
  pointer pAVar7;
  pointer pAVar8;
  double dVar9;
  Socket_Exception *e;
  Database_Exception *e_1;
  runtime_error *e_2;
  logic_error *e_3;
  exception *e_4;
  unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_> local_b8;
  unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_> action;
  string local_a8;
  allocator<char> local_71;
  key_type local_70;
  size_type local_50;
  size_t size;
  EOClient *client;
  Client *rawclient;
  iterator __end1;
  iterator __begin1;
  list<Client_*,_std::allocator<Client_*>_> *__range1;
  double now;
  EOServer *server;
  void *server_void_local;
  
  dVar9 = Timer::GetTime();
  __end1 = std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::begin
                     ((list<Client_*,_std::allocator<Client_*>_> *)((long)server_void + 0x38));
  rawclient = (Client *)
              std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::end
                        ((list<Client_*,_std::allocator<Client_*>_> *)((long)server_void + 0x38));
  while (bVar2 = std::operator!=(&__end1,(_Self *)&rawclient), bVar2) {
    ppCVar4 = std::_List_iterator<Client_*>::operator*(&__end1);
    size = (size_t)*ppCVar4;
    client = (EOClient *)size;
    bVar2 = Client::Connected((Client *)size);
    if (bVar2) {
      sVar5 = std::
              queue<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::deque<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>_>
              ::size((queue<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::deque<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>_>
                      *)(size + 0x140));
      lVar1 = *(long *)((long)server_void + 0x90);
      local_50 = sVar5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"PacketQueueMax",&local_71);
      this = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                           *)(lVar1 + 0x198),&local_70);
      iVar3 = util::variant::operator_cast_to_int(this);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
      if ((ulong)(long)iVar3 < sVar5) {
        action._M_t.
        super___uniq_ptr_impl<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>._M_t.
        super__Tuple_impl<0UL,_ActionQueue_Action_*,_std::default_delete<ActionQueue_Action>_>.
        super__Head_base<0UL,_ActionQueue_Action_*,_false>._M_head_impl._4_4_ =
             Client::GetRemoteAddr((Client *)size);
        IPAddress::operator_cast_to_string
                  (&local_a8,
                   (IPAddress *)
                   ((long)&action._M_t.
                           super___uniq_ptr_impl<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ActionQueue_Action_*,_std::default_delete<ActionQueue_Action>_>
                           .super__Head_base<0UL,_ActionQueue_Action_*,_false>._M_head_impl + 4));
        std::__cxx11::string::c_str();
        Console::Wrn("Client was disconnected for filling up the action queue: %s");
        std::__cxx11::string::~string((string *)&local_a8);
        Client::Close((Client *)size,false);
      }
      else if ((local_50 != 0) && (*(double *)(size + 400) <= dVar9)) {
        pvVar6 = std::
                 queue<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::deque<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>_>
                 ::front((queue<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::deque<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>_>
                          *)(size + 0x140));
        std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>::unique_ptr
                  (&local_b8,pvVar6);
        std::
        queue<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::deque<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>_>
        ::pop((queue<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::deque<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>_>
               *)(size + 0x140));
        pAVar7 = std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>::
                 operator->(&local_b8);
        family = PacketReader::Family(&pAVar7->reader);
        pAVar7 = std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>::
                 operator->(&local_b8);
        action_00 = PacketReader::Action(&pAVar7->reader);
        client_00 = size;
        pAVar7 = std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>::
                 operator->(&local_b8);
        pAVar8 = std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>::
                 operator->(&local_b8);
        Handlers::Handle(family,action_00,(EOClient *)client_00,&pAVar7->reader,
                         (bool)(~pAVar8->auto_queue & 1));
        pAVar7 = std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>::
                 operator->(&local_b8);
        *(double *)(size + 400) = dVar9 + pAVar7->time;
        std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>::~unique_ptr
                  (&local_b8);
      }
    }
    std::_List_iterator<Client_*>::operator++(&__end1);
  }
  return;
}

Assistant:

void server_pump_queue(void *server_void)
{
	EOServer *server = static_cast<EOServer *>(server_void);
	double now = Timer::GetTime();

	UTIL_FOREACH(server->clients, rawclient)
	{
		EOClient *client = static_cast<EOClient *>(rawclient);

		if (!client->Connected())
			continue;

		std::size_t size = client->queue.queue.size();

		if (size > std::size_t(int(server->world->config["PacketQueueMax"])))
		{
			Console::Wrn("Client was disconnected for filling up the action queue: %s", static_cast<std::string>(client->GetRemoteAddr()).c_str());
			client->Close();
			continue;
		}

		if (size != 0 && client->queue.next <= now)
		{
			std::unique_ptr<ActionQueue_Action> action = std::move(client->queue.queue.front());
			client->queue.queue.pop();

#ifndef DEBUG_EXCEPTIONS
			try
			{
#endif // DEBUG_EXCEPTIONS
				Handlers::Handle(action->reader.Family(), action->reader.Action(), client, action->reader, !action->auto_queue);
#ifndef DEBUG_EXCEPTIONS
			}
			catch (Socket_Exception& e)
			{
				Console::Err("Client caused an exception and was closed: %s.", static_cast<std::string>(client->GetRemoteAddr()).c_str());
				Console::Err("%s: %s", e.what(), e.error());
				client->Close();
			}
			catch (Database_Exception& e)
			{
				Console::Err("Client caused an exception and was closed: %s.", static_cast<std::string>(client->GetRemoteAddr()).c_str());
				Console::Err("%s: %s", e.what(), e.error());
				client->Close();
			}
			catch (std::runtime_error& e)
			{
				Console::Err("Client caused an exception and was closed: %s.", static_cast<std::string>(client->GetRemoteAddr()).c_str());
				Console::Err("Runtime Error: %s", e.what());
				client->Close();
			}
			catch (std::logic_error& e)
			{
				Console::Err("Client caused an exception and was closed: %s.", static_cast<std::string>(client->GetRemoteAddr()).c_str());
				Console::Err("Logic Error: %s", e.what());
				client->Close();
			}
			catch (std::exception& e)
			{
				Console::Err("Client caused an exception and was closed: %s.", static_cast<std::string>(client->GetRemoteAddr()).c_str());
				Console::Err("Uncaught Exception: %s", e.what());
				client->Close();
			}
			catch (...)
			{
				Console::Err("Client caused an exception and was closed: %s.", static_cast<std::string>(client->GetRemoteAddr()).c_str());
				client->Close();
			}
#endif // DEBUG_EXCEPTIONS

			client->queue.next = now + action->time;
		}
	}
}